

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccf507::SSETest::RunTest
          (SSETest *this,bool is_random,int width,int height,int run_times)

{
  ACMRandom *this_00;
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  Message *pMVar9;
  int iVar10;
  ulong uVar11;
  uchar *puVar12;
  undefined7 in_register_00000031;
  uint8_t *puVar13;
  SEARCH_METHODS *message;
  int16_t val;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  int height_local;
  int width_local;
  int local_e4;
  int local_e0;
  int local_dc;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  ulong local_d0;
  undefined4 local_c8;
  int local_c4;
  int64_t res_ref;
  AssertionResult gtest_ar;
  AssertHelper local_88;
  char *local_80;
  int64_t res_tst;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  
  local_c8 = (undefined4)CONCAT71(in_register_00000031,is_random);
  this_00 = &this->rnd_;
  local_e4 = 0;
  height_local = height;
  width_local = width;
  local_c4 = run_times;
  for (local_dc = 0; local_dc < 3; local_dc = local_dc + 1) {
    do {
      uVar7 = testing::internal::Random::Generate(&this_00->random_,7);
      iVar14 = 4 << ((byte)uVar7 & 0x1f);
    } while (iVar14 < width_local);
    local_e0 = iVar14;
    if ((char)local_c8 == '\0') {
      val = 0xff;
      if (this->is_hbd_ != false) {
        val = 0xfff;
      }
      if (local_dc == 0) {
        GenExtremeData(this,width_local,height_local,iVar14,this->src_,0);
        puVar13 = this->ref_;
      }
      else {
        GenExtremeData(this,width_local,height_local,iVar14,this->src_,val);
        puVar13 = this->ref_;
        val = 0;
      }
      GenExtremeData(this,width_local,height_local,iVar14,puVar13,val);
    }
    else {
      puVar13 = this->src_;
      puVar1 = this->ref_;
      uVar2 = width_local;
      if (width_local < 1) {
        uVar2 = 0;
      }
      uVar3 = height_local;
      if (height_local < 1) {
        uVar3 = 0;
      }
      uVar11 = 0;
      for (uVar8 = 0; uVar15 = (ulong)uVar2, uVar5 = uVar11, uVar8 != uVar3; uVar8 = uVar8 + 1) {
        while (local_d0 = uVar5, uVar15 != 0) {
          if (this->is_hbd_ == false) {
            uVar6 = libaom_test::ACMRandom::Rand8(this_00);
            this->src_[uVar11] = uVar6;
            uVar6 = libaom_test::ACMRandom::Rand8(this_00);
            this->ref_[uVar11] = uVar6;
          }
          else {
            uVar7 = testing::internal::Random::Generate(&this_00->random_,0x1000);
            *(short *)(puVar13 + uVar11 * 2) = (short)uVar7;
            uVar7 = testing::internal::Random::Generate(&this_00->random_,0x1000);
            *(short *)(puVar1 + uVar11 * 2) = (short)uVar7;
          }
          uVar11 = uVar11 + 1;
          uVar15 = uVar15 - 1;
          uVar5 = local_d0;
        }
        uVar11 = local_d0 + (long)iVar14;
      }
    }
    iVar14 = local_e0;
    puVar12 = (uchar *)((ulong)this->ref_ >> 1);
    puVar4 = (uchar *)((ulong)this->src_ >> 1);
    if (this->is_hbd_ == false) {
      puVar12 = this->ref_;
      puVar4 = this->src_;
    }
    res_ref = (*(this->params_).ref_func)(puVar4,local_e0,puVar12,local_e0,width_local,height_local)
    ;
    res_tst = (*(this->params_).tst_func)(puVar4,iVar14,puVar12,iVar14,width_local,height_local);
    iVar14 = local_c4;
    if (local_c4 < 2) {
      bVar16 = local_e4 == 0;
      local_e4 = 1;
      if (bVar16) {
        local_e4 = 0;
        bVar16 = res_ref != res_tst;
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&gtest_ar,"res_ref","res_tst",&res_ref,&res_tst);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_d8);
          std::operator<<((ostream *)(local_d8._M_head_impl + 0x10),"Error:");
          local_80 = " ";
          if (this->is_hbd_ != false) {
            local_80 = "hbd ";
          }
          pMVar9 = testing::Message::operator<<((Message *)&local_d8,&local_80);
          pMVar9 = testing::Message::operator<<(pMVar9,&local_dc);
          pMVar9 = testing::Message::operator<<(pMVar9,(char (*) [12])" SSE Test [");
          pMVar9 = testing::Message::operator<<(pMVar9,&width_local);
          pMVar9 = testing::Message::operator<<(pMVar9,(char (*) [2])0xaa8802);
          pMVar9 = testing::Message::operator<<(pMVar9,&height_local);
          pMVar9 = testing::Message::operator<<
                             (pMVar9,(char (*) [44])"] C output does not match optimized output.");
          message = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            message = *(SEARCH_METHODS **)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sum_squares_test.cc"
                     ,0x188,(char *)message);
          testing::internal::AssertHelper::operator=(&local_88,pMVar9);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_d8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_d8._M_head_impl + 8))();
          }
        }
        local_e4 = CONCAT31((int3)((uint)local_e4 >> 8),bVar16);
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
      }
    }
    else {
      ::aom_usec_timer_start(&ref_timer);
      iVar10 = iVar14;
      while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
        (*(this->params_).ref_func)(puVar4,local_e0,puVar12,local_e0,width_local,height_local);
      }
      ::aom_usec_timer_mark(&ref_timer);
      local_d0 = ::aom_usec_timer_elapsed(&ref_timer);
      ::aom_usec_timer_start(&test_timer);
      iVar10 = local_e0;
      while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
        (*(this->params_).tst_func)(puVar4,iVar10,puVar12,iVar10,width_local,height_local);
      }
      ::aom_usec_timer_mark(&test_timer);
      uVar8 = ::aom_usec_timer_elapsed(&test_timer);
      printf("c_time=%d \t simd_time=%d \t gain=%d\n",local_d0,uVar8 & 0xffffffff,
             (long)((ulong)(uint)((int)local_d0 >> 0x1f) << 0x20 | local_d0 & 0xffffffff) /
             (long)(int)uVar8 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void SSETest::RunTest(bool is_random, int width, int height, int run_times) {
  int failed = 0;
  aom_usec_timer ref_timer, test_timer;
  for (int k = 0; k < 3; k++) {
    int stride = 4 << rnd_(7);  // Up to 256 stride
    while (stride < width) {    // Make sure it's valid
      stride = 4 << rnd_(7);
    }
    if (is_random) {
      GenRandomData(width, height, stride);
    } else {
      const int msb = is_hbd_ ? 12 : 8;  // Up to 12 bit input
      const int limit = (1 << msb) - 1;
      if (k == 0) {
        GenExtremeData(width, height, stride, src_, 0);
        GenExtremeData(width, height, stride, ref_, limit);
      } else {
        GenExtremeData(width, height, stride, src_, limit);
        GenExtremeData(width, height, stride, ref_, 0);
      }
    }
    int64_t res_ref, res_tst;
    uint8_t *src = src_;
    uint8_t *ref = ref_;
    if (is_hbd_) {
      src = CONVERT_TO_BYTEPTR(src_);
      ref = CONVERT_TO_BYTEPTR(ref_);
    }
    res_ref = params_.ref_func(src, stride, ref, stride, width, height);
    res_tst = params_.tst_func(src, stride, ref, stride, width, height);
    if (run_times > 1) {
      aom_usec_timer_start(&ref_timer);
      for (int j = 0; j < run_times; j++) {
        params_.ref_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&ref_timer);
      const int elapsed_time_c =
          static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

      aom_usec_timer_start(&test_timer);
      for (int j = 0; j < run_times; j++) {
        params_.tst_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&test_timer);
      const int elapsed_time_simd =
          static_cast<int>(aom_usec_timer_elapsed(&test_timer));

      printf(
          "c_time=%d \t simd_time=%d \t "
          "gain=%d\n",
          elapsed_time_c, elapsed_time_simd,
          (elapsed_time_c / elapsed_time_simd));
    } else {
      if (!failed) {
        failed = res_ref != res_tst;
        EXPECT_EQ(res_ref, res_tst)
            << "Error:" << (is_hbd_ ? "hbd " : " ") << k << " SSE Test ["
            << width << "x" << height
            << "] C output does not match optimized output.";
      }
    }
  }
}